

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
mxx::impl::distribute_container<std::vector<int,_std::allocator<int>_>_>::distribute
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<int,_std::allocator<int>_> *c,comm *comm)

{
  size_t local_size;
  custom_op<unsigned_long> op;
  long local_70;
  ulong local_68;
  custom_op<unsigned_long> local_60;
  
  if (comm->m_size == 1) {
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,c);
  }
  else {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70 = (long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2;
    custom_op<unsigned_long>::custom_op<std::plus<unsigned_long>>(&local_60,1);
    MPI_Allreduce(&local_70,&local_68,1,local_60.m_type_copy,local_60.m_op,comm->mpi_comm);
    custom_op<unsigned_long>::~custom_op(&local_60);
    std::vector<int,_std::allocator<int>_>::resize
              (__return_storage_ptr__,
               local_68 / (uint)comm->m_size +
               (ulong)((ulong)(uint)comm->m_rank < local_68 % (ulong)(uint)comm->m_size));
    distribute<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                        (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,comm);
  }
  return __return_storage_ptr__;
}

Assistant:

inline static Container distribute(const Container& c, const mxx::comm& comm) {
        if (comm.size() == 1)
            return c;
        Container result;
        size_t local_size = c.size();
        // TODO: this allreduce is duplicated in the `distribute` function
        //       which could be avoided
        size_t total_size = mxx::allreduce(local_size, comm);
        blk_dist part(total_size, comm.size(), comm.rank());
        result.resize(part.local_size());

        // call the iterator based implementation
        ::mxx::distribute(std::begin(c), std::end(c), std::begin(result), comm);

        // return the container
        return result;
    }